

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O3

void __thiscall FIX::shared_array<int>::release(shared_array<int> *this)

{
  long *plVar1;
  int *piVar2;
  atomic<long> *counter;
  
  plVar1 = (long *)this->m_buffer;
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      piVar2 = this->m_buffer;
      this->m_size = 0;
      this->m_buffer = (int *)0x0;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

bool empty() const { return m_buffer == 0; }